

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::
int_writer<unsigned__int128>
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>
           *this,back_insert_iterator<fmt::v7::detail::buffer<char>_> output,locale_ref loc,
          unsigned___int128 value,basic_format_specs<char> *s)

{
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128> *piVar1
  ;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined6 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128> iVar5;
  basic_format_specs<char> *s_local;
  unsigned___int128 value_local;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
  *this_local;
  locale_ref loc_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> output_local;
  
  *(buffer<char> **)this = output.container;
  *(void **)(this + 8) = loc.locale_;
  *(undefined8 *)(this + 0x10) = in_R9;
  *(undefined8 *)(this + 0x28) = in_R8;
  *(basic_format_specs<char> **)(this + 0x20) = s;
  *(undefined4 *)(this + 0x34) = 0;
  auVar3[6] = in_stack_ffffffffffffff8e;
  auVar3._0_6_ = in_stack_ffffffffffffff88;
  auVar3[7] = in_stack_ffffffffffffff8f;
  auVar3._8_8_ = this;
  bVar4 = is_negative<unsigned___int128,_0>((unsigned___int128)auVar3);
  if (bVar4) {
    this[0x30] = (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>
                  )0x2d;
    *(int *)(this + 0x34) = *(int *)(this + 0x34) + 1;
    piVar1 = this + 0x20;
    lVar2 = *(long *)piVar1;
    *(long *)piVar1 = -*(long *)piVar1;
    *(ulong *)(this + 0x28) = -(ulong)(lVar2 != 0) - *(long *)(this + 0x28);
  }
  else if (((*(byte *)(*(long *)(this + 0x10) + 9) >> 4 & 7) != 0) &&
          ((*(byte *)(*(long *)(this + 0x10) + 9) >> 4 & 7) != 1)) {
    iVar5 = (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>
             )0x2b;
    if ((*(byte *)(*(long *)(this + 0x10) + 9) >> 4 & 7) != 2) {
      iVar5 = (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>
               )0x20;
    }
    this[0x30] = iVar5;
    *(int *)(this + 0x34) = *(int *)(this + 0x34) + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }